

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

int Cudd_ApaPrintDensity(FILE *fp,DdManager *dd,DdNode *node,int nvars)

{
  uint divisor;
  uint uVar1;
  int iVar2;
  int iVar3;
  DdApaNumber dividend;
  DdApaNumber quotient;
  uint fractional;
  uint remainder;
  uint size;
  DdApaNumber density;
  DdApaNumber count;
  int local_30;
  int result;
  int digits;
  int nvars_local;
  DdNode *node_local;
  DdManager *dd_local;
  FILE *fp_local;
  
  result = nvars;
  _digits = node;
  node_local = &dd->sentinel;
  dd_local = (DdManager *)fp;
  dividend = Cudd_ApaCountMinterm(dd,node,nvars,&local_30);
  if (dividend == (DdApaNumber)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    divisor = Cudd_DagSize(_digits);
    quotient = Cudd_NewApaNumber(local_30);
    uVar1 = Cudd_ApaIntDivision(local_30,dividend,divisor,quotient);
    iVar2 = Cudd_ApaPrintDecimal((FILE *)dd_local,local_30,quotient);
    if (dividend != (DdApaNumber)0x0) {
      free(dividend);
    }
    if (quotient != (DdApaNumber)0x0) {
      free(quotient);
    }
    iVar3 = fprintf((FILE *)dd_local,".%u\n",
                    (long)(((double)uVar1 / (double)divisor) * 1000000.0) & 0xffffffff);
    fp_local._4_4_ = iVar2;
    if (iVar3 == -1) {
      fp_local._4_4_ = 0;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int
Cudd_ApaPrintDensity(
  FILE * fp,
  DdManager * dd,
  DdNode * node,
  int  nvars)
{
    int digits;
    int result;
    DdApaNumber count,density;
    unsigned int size, remainder, fractional;

    count = Cudd_ApaCountMinterm(dd,node,nvars,&digits);
    if (count == NULL)
        return(0);
    size = Cudd_DagSize(node);
    density = Cudd_NewApaNumber(digits);
    remainder = Cudd_ApaIntDivision(digits,count,size,density);
    result = Cudd_ApaPrintDecimal(fp,digits,density);
    ABC_FREE(count);
    ABC_FREE(density);
    fractional = (unsigned int)((double)remainder / size * 1000000);
    if (fprintf(fp,".%u\n", fractional) == EOF) {
        return(0);
    }
    return(result);

}